

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

FStateDefine *
FStateDefinitions::FindStateLabelInList
          (TArray<FStateDefine,_FStateDefine> *list,FName *name,bool create)

{
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  FStateDefine *pFVar4;
  undefined1 local_50 [8];
  FStateDefine def;
  uint i;
  bool create_local;
  FName *name_local;
  TArray<FStateDefine,_FStateDefine> *list_local;
  
  def.DefineFlags = '\0';
  def._33_3_ = 0;
  def._39_1_ = create;
  while( true ) {
    uVar1 = def._32_4_;
    uVar3 = TArray<FStateDefine,_FStateDefine>::Size(list);
    if (uVar3 <= (uint)uVar1) {
      if ((def._39_1_ & 1) == 0) {
        list_local = (TArray<FStateDefine,_FStateDefine> *)0x0;
      }
      else {
        FStateDefine::FStateDefine((FStateDefine *)local_50);
        FName::operator=((FName *)local_50,name);
        def.Children.Most = 0;
        def.Children.Count = 0;
        def.State._0_1_ = 0;
        uVar3 = TArray<FStateDefine,_FStateDefine>::Push(list,(FStateDefine *)local_50);
        list_local = (TArray<FStateDefine,_FStateDefine> *)
                     TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)uVar3);
        FStateDefine::~FStateDefine((FStateDefine *)local_50);
      }
      return (FStateDefine *)list_local;
    }
    pFVar4 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)(uint)def._32_4_);
    bVar2 = FName::operator==(&pFVar4->Label,name);
    if (bVar2) break;
    def._32_4_ = def._32_4_ + 1;
  }
  pFVar4 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)(uint)def._32_4_);
  return pFVar4;
}

Assistant:

FStateDefine *FStateDefinitions::FindStateLabelInList(TArray<FStateDefine> & list, FName name, bool create)
{
	for(unsigned i = 0; i<list.Size(); i++)
	{
		if (list[i].Label == name)
		{
			return &list[i];
		}
	}
	if (create)
	{
		FStateDefine def;
		def.Label = name;
		def.State = NULL;
		def.DefineFlags = SDF_NEXT;
		return &list[list.Push(def)];
	}
	return NULL;
}